

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkyd(fitsfile *fptr,char *keyname,double value,int decim,char *comm,int *status)

{
  int iVar1;
  char local_138 [8];
  char card [81];
  char local_d8 [8];
  char oldcomm [73];
  char valstring [71];
  int *status_local;
  char *comm_local;
  int decim_local;
  double value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = ffgkey(fptr,keyname,oldcomm + 0x48,local_d8,status);
    if (iVar1 < 1) {
      ffd2e(value,decim,oldcomm + 0x48,status);
      if ((comm == (char *)0x0) || (*comm == '&')) {
        ffmkky(keyname,oldcomm + 0x48,local_d8,local_138,status);
      }
      else {
        ffmkky(keyname,oldcomm + 0x48,comm,local_138,status);
      }
      ffmkey(fptr,local_138,status);
      fptr_local._4_4_ = *status;
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffmkyd(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double value,            /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffd2e(value, decim, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}